

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_uninit(ma_context *pContext)

{
  _func_ma_result_ma_context_ptr *p_Var1;
  ma_result mVar2;
  
  if (pContext == (ma_context *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    p_Var1 = (pContext->callbacks).onContextUninit;
    if (p_Var1 != (_func_ma_result_ma_context_ptr *)0x0) {
      (*p_Var1)(pContext);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&pContext->deviceEnumLock);
    pthread_mutex_destroy((pthread_mutex_t *)&pContext->deviceInfoLock);
    ma_free(pContext->pDeviceInfos,&pContext->allocationCallbacks);
    mVar2 = MA_SUCCESS;
    if (pContext->pLog == &pContext->log) {
      pthread_mutex_destroy((pthread_mutex_t *)&(pContext->log).lock);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_context_uninit(ma_context* pContext)
{
    if (pContext == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pContext->callbacks.onContextUninit != NULL) {
        pContext->callbacks.onContextUninit(pContext);
    }

    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma_free(pContext->pDeviceInfos, &pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);

    if (pContext->pLog == &pContext->log) {
        ma_log_uninit(&pContext->log);
    }

    return MA_SUCCESS;
}